

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateGetEnumDescriptorSpecializations
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_1c);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateGetEnumDescriptorSpecializations(this_01,printer);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = Descriptor::enum_type_count(this->descriptor_);
    if (iVar1 <= local_20) break;
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)local_20);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_02);
    EnumGenerator::GenerateGetEnumDescriptorSpecializations(this_03,printer);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
}